

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_ecc_weierstrass_decompress(void)

{
  size_t sVar1;
  size_t sVar2;
  WeierstrassPoint *pWVar3;
  WeierstrassPoint *pWVar4;
  WeierstrassPoint *a_1;
  mp_int *X;
  WeierstrassPoint *A;
  size_t i;
  size_t p;
  WeierstrassPoint *a;
  mp_int *x;
  WeierstrassCurve *wc;
  
  x = (mp_int *)wcurve();
  a = (WeierstrassPoint *)mp_new(0x90);
  p = (size_t)ecc_weierstrass_point_new_from_x((WeierstrassCurve *)x,(mp_int *)a,0);
  if ((WeierstrassPoint *)p != (WeierstrassPoint *)0x0) {
    ecc_weierstrass_point_free((WeierstrassPoint *)p);
  }
  i = 0;
  while( true ) {
    sVar1 = i;
    sVar2 = (*looplimit)(2);
    if (sVar2 <= sVar1) break;
    A = (WeierstrassPoint *)0x1;
    while( true ) {
      pWVar4 = A;
      pWVar3 = (WeierstrassPoint *)(*looplimit)(5);
      if (pWVar3 <= pWVar4) break;
      X = (mp_int *)wpoint((WeierstrassCurve *)x,(size_t)A);
      ecc_weierstrass_get_affine((WeierstrassPoint *)X,(mp_int **)&a_1,(mp_int **)0x0);
      mp_copy_into((mp_int *)a,(mp_int *)a_1);
      mp_free((mp_int *)a_1);
      ecc_weierstrass_point_free((WeierstrassPoint *)X);
      log_start();
      pWVar4 = ecc_weierstrass_point_new_from_x((WeierstrassCurve *)x,(mp_int *)a,(uint)i);
      log_end();
      ecc_weierstrass_point_free(pWVar4);
      A = (WeierstrassPoint *)((long)&A->X + 1);
    }
    i = i + 1;
  }
  mp_free((mp_int *)a);
  ecc_weierstrass_curve_free((WeierstrassCurve *)x);
  return;
}

Assistant:

static void test_ecc_weierstrass_decompress(void)
{
    WeierstrassCurve *wc = wcurve();

    /* As in the mp_modsqrt test, prime the lazy initialisation of the
     * ModsqrtContext */
    mp_int *x = mp_new(144);
    WeierstrassPoint *a = ecc_weierstrass_point_new_from_x(wc, x, 0);
    if (a)                 /* don't care whether this one succeeded */
        ecc_weierstrass_point_free(a);

    for (size_t p = 0; p < looplimit(2); p++) {
        for (size_t i = 1; i < looplimit(5); i++) {
            WeierstrassPoint *A = wpoint(wc, i);
            mp_int *X;
            ecc_weierstrass_get_affine(A, &X, NULL);
            mp_copy_into(x, X);
            mp_free(X);
            ecc_weierstrass_point_free(A);

            log_start();
            WeierstrassPoint *a = ecc_weierstrass_point_new_from_x(wc, x, p);
            log_end();

            ecc_weierstrass_point_free(a);
        }
    }
    mp_free(x);
    ecc_weierstrass_curve_free(wc);
}